

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::
vector<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,pstd::pmr::polymorphic_allocator<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>>
::emplace_back<pstd::pmr::polymorphic_allocator<std::byte>&>
          (vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
           *this,polymorphic_allocator<std::byte> *args)

{
  polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_> *in_RSI;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
  *unaff_retaddr;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffffe0;
  
  if (in_RDI->nAlloc == in_RDI->nStored) {
    if (in_RDI->nAlloc == 0) {
      in_stack_ffffffffffffffe0 = (polymorphic_allocator<std::byte> *)0x4;
    }
    else {
      in_stack_ffffffffffffffe0 = (polymorphic_allocator<std::byte> *)(in_RDI->nAlloc << 1);
    }
    vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
    ::reserve(unaff_retaddr,(size_t)in_RDI);
  }
  pmr::polymorphic_allocator<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>::
  construct<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,pstd::pmr::polymorphic_allocator<std::byte>&>
            (in_RSI,in_RDI,in_stack_ffffffffffffffe0);
  in_RDI->nStored = in_RDI->nStored + 1;
  return;
}

Assistant:

void emplace_back(Args &&...args) {
        if (nAlloc == nStored)
            reserve(nAlloc == 0 ? 4 : 2 * nAlloc);

        alloc.construct(ptr + nStored, std::forward<Args>(args)...);
        ++nStored;
    }